

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

int bf_read(bfile_t *bfile,uint8_t *buffer,uint len)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = bfile->size - bfile->pos;
  if (len <= uVar3) {
    uVar3 = (ulong)len;
  }
  if (uVar3 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if (bfile->pos < bfile->ipos) {
        uVar2 = bfile->pos % (ulong)bfile->buffer_size;
        uVar1 = bfile->buffer_size - uVar2;
        __n = uVar3 - uVar4;
        if (uVar1 < uVar3 - uVar4) {
          __n = uVar1;
        }
        memcpy(buffer + uVar4,bfile->buffer + uVar2,__n);
        uVar4 = uVar4 + __n;
        bfile->pos = bfile->pos + __n;
      }
      else {
        bf_read_buffer(bfile);
      }
    } while (uVar4 < uVar3);
  }
  return (int)uVar4;
}

Assistant:

int
bf_read(
    bfile_t * bfile,
    uint8_t * buffer,
    unsigned int len )
{
    size_t toread, hasread;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    hasread = 0;
    toread = PRF_MIN( len, bfile->size - bfile->pos ); /* crop read length */
    while ( hasread < toread ) {
        if ( bfile->pos < bfile->ipos ) {
            size_t bufoff;
            size_t cpylen;
            bufoff = bfile->pos % bfile->buffer_size;
            cpylen = PRF_MIN( bfile->buffer_size - bufoff, toread - hasread );
            memcpy( buffer + hasread, bfile->buffer + bufoff, cpylen );
            hasread += cpylen;
            bfile->pos += cpylen;
        } else {
            bf_read_buffer( bfile );
        }
    }

    return (int)hasread;
}